

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

void re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Regexp *this;
  int iVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Regexp *pRVar6;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 aVar7;
  Regexp *this_00;
  ulong uVar8;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar9;
  ulong uVar10;
  Regexp *this_01;
  LogMessage local_1b0;
  
  this = *r1ptr;
  paVar9 = &this->field_5;
  paVar5 = paVar9;
  if (1 < this->nsub_) {
    paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  this_01 = *r2ptr;
  pRVar6 = Regexp::Incref(paVar5->subone_);
  pRVar6 = Regexp::Repeat(pRVar6,(uint)this->parse_flags_,0,0);
  switch(this->op_) {
  case '\a':
    aVar7.max_ = -1;
    aVar7.min_ = 0;
    goto LAB_0013a8ca;
  case '\b':
    aVar7.max_ = -1;
    aVar7.min_ = 1;
LAB_0013a8ca:
    (pRVar6->field_7).field_0 = aVar7;
    break;
  case '\t':
    *(int *)&pRVar6->field_7 = 1;
    *(int *)((long)&pRVar6->field_7 + 4) = 0;
    break;
  case '\n':
    (pRVar6->field_7).field_0.min_ = (this->field_7).field_0.min_;
    if (this->op_ != '\n') goto LAB_0013aaee;
    (pRVar6->field_7).field_0.max_ = (this->field_7).field_0.max_;
    break;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x167,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"DoCoalesce failed: r1->op() is ",0x1f);
    std::ostream::operator<<((ostream *)&local_1b0.str_,(uint)this->op_);
    goto LAB_0013aa76;
  }
  switch(this_01->op_) {
  case '\x03':
  case '\f':
  case '\r':
  case '\x14':
    piVar1 = &(pRVar6->field_7).field_0.min_;
    *piVar1 = *piVar1 + 1;
  case '\t':
    if (pRVar6->op_ != '\n') {
LAB_0013aaee:
      __assert_fail("(op_) == (kRegexpRepeat)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x148,"int re2::Regexp::max()");
    }
    iVar4 = (pRVar6->field_7).field_0.max_;
    if (iVar4 != -1) {
      (pRVar6->field_7).field_0.max_ = iVar4 + 1;
    }
    break;
  case '\x04':
    if (1 < this->nsub_) {
      paVar9 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    if (paVar9->subone_->op_ != '\x03') {
      __assert_fail("(op_) == (kRegexpLiteral)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x149,"Rune re2::Regexp::rune()");
    }
    if (this_01->op_ != '\x04') {
LAB_0013aa17:
      __assert_fail("(op_) == (kRegexpLiteralString)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x14e,"int re2::Regexp::nrunes()");
    }
    uVar3 = (this_01->field_7).field_0.max_;
    uVar8 = 1;
    if (1 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    for (uVar10 = 1; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      if (*(int *)((long)&(((this_01->field_7).field_1.name_)->_M_dataplus)._M_p + uVar10 * 4) !=
          (paVar9->subone_->field_7).field_0.max_) {
        uVar8 = uVar10 & 0xffffffff;
        break;
      }
    }
    piVar1 = &(pRVar6->field_7).field_0.min_;
    iVar4 = (int)uVar8;
    *piVar1 = *piVar1 + iVar4;
    if (pRVar6->op_ != '\n') goto LAB_0013aaee;
    iVar2 = (pRVar6->field_7).field_0.max_;
    if (iVar2 != -1) {
      (pRVar6->field_7).field_0.max_ = iVar2 + iVar4;
    }
    if (this_01->op_ != '\x04') goto LAB_0013aa17;
    if (iVar4 == (this_01->field_7).field_0.max_) break;
    *r1ptr = pRVar6;
    pRVar6 = Regexp::LiteralString
                       ((Rune *)((long)&(((this_01->field_7).field_1.name_)->_M_dataplus)._M_p +
                                uVar8 * 4),(this_01->field_7).field_0.max_ - iVar4,
                        (uint)this_01->parse_flags_);
    goto LAB_0013a9b3;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x1a4,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"DoCoalesce failed: r2->op() is ",0x1f);
    std::ostream::operator<<((ostream *)&local_1b0.str_,(uint)this_01->op_);
LAB_0013aa76:
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    this_01 = pRVar6;
    goto LAB_0013aa83;
  case '\b':
    piVar1 = &(pRVar6->field_7).field_0.min_;
    *piVar1 = *piVar1 + 1;
  case '\a':
switchD_0013a8ec_caseD_7:
    (pRVar6->field_7).field_0.max_ = -1;
    break;
  case '\n':
    piVar1 = &(pRVar6->field_7).field_0.min_;
    *piVar1 = *piVar1 + (this_01->field_7).field_0.min_;
    if (this_01->op_ != '\n') goto LAB_0013aaee;
    iVar4 = (this_01->field_7).field_0.max_;
    if (iVar4 == -1) goto switchD_0013a8ec_caseD_7;
    if (pRVar6->op_ != '\n') goto LAB_0013aaee;
    iVar2 = (pRVar6->field_7).field_0.max_;
    if (iVar2 != -1) {
      (pRVar6->field_7).field_0.max_ = iVar2 + iVar4;
    }
  }
  this_00 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this_00,kRegexpEmptyMatch,NoParseFlags);
  *r1ptr = this_00;
LAB_0013a9b3:
  *r2ptr = pRVar6;
  Regexp::Decref(this);
LAB_0013aa83:
  Regexp::Decref(this_01);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->min_ = 0;
      nre->max_ = -1;
      break;

    case kRegexpPlus:
      nre->min_ = 1;
      nre->max_ = -1;
      break;

    case kRegexpQuest:
      nre->min_ = 0;
      nre->max_ = 1;
      break;

    case kRegexpRepeat:
      nre->min_ = r1->min();
      nre->max_ = r1->max();
      break;

    default:
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      nre->Decref();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->min_++;
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->min_ += r2->min();
      if (r2->max() == -1)
        nre->max_ = -1;
      else if (nre->max() != -1)
        nre->max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->min_++;
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->min_ += n;
      if (nre->max() != -1)
        nre->max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      nre->Decref();
      return;
  }

  r1->Decref();
  r2->Decref();
}